

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginFverb.cpp
# Opt level: O0

void __thiscall PluginFverb::initParameter(PluginFverb *this,uint32_t index,Parameter *parameter)

{
  bool bVar1;
  uint index_00;
  char *pcVar2;
  ParameterRange *pPVar3;
  ParameterRange *range;
  Parameter *parameter_local;
  uint32_t index_local;
  PluginFverb *this_local;
  
  if (index < 0xf) {
    switch(index) {
    case 0:
      DISTRHO::Parameter::initDesignation(parameter,kParameterDesignationBypass);
      break;
    default:
      if ((index == 0) || (0xb < index)) {
        d_safe_assert("index >= pIdDspFirst && index <= pIdDspLast",
                      "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/plugins/fverb/PluginFverb.cpp"
                      ,0x5e);
      }
      else {
        index_00 = index - 1;
        parameter->hints = 1;
        pcVar2 = Fverb::parameter_label(index_00);
        DISTRHO::String::operator=(&parameter->name,pcVar2);
        pcVar2 = Fverb::parameter_short_label(index_00);
        DISTRHO::String::operator=(&parameter->shortName,pcVar2);
        pcVar2 = Fverb::parameter_symbol(index_00);
        DISTRHO::String::operator=(&parameter->symbol,pcVar2);
        pcVar2 = Fverb::parameter_unit(index_00);
        DISTRHO::String::operator=(&parameter->unit,pcVar2);
        pPVar3 = Fverb::parameter_range(index_00);
        (parameter->ranges).def = pPVar3->init;
        (parameter->ranges).min = pPVar3->min;
        (parameter->ranges).max = pPVar3->max;
        bVar1 = Fverb::parameter_is_trigger(index_00);
        if (bVar1) {
          parameter->hints = parameter->hints | 0x22;
        }
        bVar1 = Fverb::parameter_is_boolean(index_00);
        if (bVar1) {
          parameter->hints = parameter->hints | 6;
        }
        bVar1 = Fverb::parameter_is_integer(index_00);
        if (bVar1) {
          parameter->hints = parameter->hints | 4;
        }
        bVar1 = Fverb::parameter_is_logarithmic(index_00);
        if (bVar1) {
          parameter->hints = parameter->hints | 8;
        }
      }
      break;
    case 0xc:
      parameter->hints = 1;
      DISTRHO::String::operator=(&parameter->name,"Dry");
      DISTRHO::String::operator=(&parameter->symbol,"dry");
      (parameter->ranges).def = 0.0;
      (parameter->ranges).min = 0.0;
      (parameter->ranges).max = 100.0;
      DISTRHO::String::operator=(&parameter->unit,"%");
      break;
    case 0xd:
      parameter->hints = 1;
      DISTRHO::String::operator=(&parameter->name,"Wet");
      DISTRHO::String::operator=(&parameter->symbol,"wet");
      (parameter->ranges).def = 0.0;
      (parameter->ranges).min = 0.0;
      (parameter->ranges).max = 100.0;
      DISTRHO::String::operator=(&parameter->unit,"%");
      break;
    case 0xe:
      parameter->hints = 1;
      DISTRHO::String::operator=(&parameter->name,"Vintage");
      DISTRHO::String::operator=(&parameter->symbol,"vintage");
      parameter->hints = parameter->hints | 6;
      (parameter->ranges).def = 0.0;
      (parameter->ranges).min = 0.0;
      (parameter->ranges).max = 1.0;
    }
  }
  else {
    d_safe_assert("index < kNumParameters",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/plugins/fverb/PluginFverb.cpp"
                  ,0x3b);
  }
  return;
}

Assistant:

void PluginFverb::initParameter(uint32_t index, Parameter &parameter)
{
    DISTRHO_SAFE_ASSERT_RETURN(index < kNumParameters, );

    switch (index) {
    case pIdBypass:
        parameter.initDesignation(kParameterDesignationBypass);
        return;
    case pIdDry:
        parameter.hints = kParameterIsAutomatable;
        parameter.name = "Dry";
        parameter.symbol = "dry";
        parameter.ranges.def = 0;
        parameter.ranges.min = 0;
        parameter.ranges.max = 100;
        parameter.unit = "%";
        return;
    case pIdWet:
        parameter.hints = kParameterIsAutomatable;
        parameter.name = "Wet";
        parameter.symbol = "wet";
        parameter.ranges.def = 0;
        parameter.ranges.min = 0;
        parameter.ranges.max = 100;
        parameter.unit = "%";
        return;
    case pIdVintage:
        parameter.hints = kParameterIsAutomatable;
        parameter.name = "Vintage";
        parameter.symbol = "vintage";
        parameter.hints |= kParameterIsBoolean|kParameterIsInteger;
        parameter.ranges.def = 0;
        parameter.ranges.min = 0;
        parameter.ranges.max = 1;
        return;
    }

    DISTRHO_SAFE_ASSERT_RETURN(index >= pIdDspFirst && index <= pIdDspLast, );
    index -= pIdDspFirst;

    parameter.hints = kParameterIsAutomatable;

    parameter.name = Fverb::parameter_label(index);
    parameter.shortName = Fverb::parameter_short_label(index);
    parameter.symbol = Fverb::parameter_symbol(index);
    parameter.unit = Fverb::parameter_unit(index);

    const Fverb::ParameterRange &range = *Fverb::parameter_range(index);
    parameter.ranges.def = range.init;
    parameter.ranges.min = range.min;
    parameter.ranges.max = range.max;

    if (Fverb::parameter_is_trigger(index))
        parameter.hints |= kParameterIsTrigger;
    if (Fverb::parameter_is_boolean(index))
        parameter.hints |= kParameterIsBoolean|kParameterIsInteger;
    if (Fverb::parameter_is_integer(index))
        parameter.hints |= kParameterIsInteger;
    if (Fverb::parameter_is_logarithmic(index))
        parameter.hints |= kParameterIsLogarithmic;
}